

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_finish_close(uv_udp_t *handle)

{
  int iVar1;
  uv__queue *q_00;
  uv__queue *q;
  uv_udp_send_t *req;
  uv_udp_t *handle_local;
  
  iVar1 = uv__io_active(&handle->io_watcher,5);
  if (iVar1 != 0) {
    __assert_fail("!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/udp.c"
                  ,0x43,"void uv__udp_finish_close(uv_udp_t *)");
  }
  if ((handle->io_watcher).fd != -1) {
    __assert_fail("handle->io_watcher.fd == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/udp.c"
                  ,0x44,"void uv__udp_finish_close(uv_udp_t *)");
  }
  while (iVar1 = uv__queue_empty(&handle->write_queue), iVar1 == 0) {
    q_00 = uv__queue_head(&handle->write_queue);
    uv__queue_remove(q_00);
    q_00[10].next = (uv__queue *)0xffffffffffffff83;
    uv__queue_insert_tail(&handle->write_completed_queue,q_00);
  }
  uv__udp_run_completed(handle);
  if (handle->send_queue_size != 0) {
    __assert_fail("handle->send_queue_size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/udp.c"
                  ,0x51,"void uv__udp_finish_close(uv_udp_t *)");
  }
  if (handle->send_queue_count != 0) {
    __assert_fail("handle->send_queue_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/udp.c"
                  ,0x52,"void uv__udp_finish_close(uv_udp_t *)");
  }
  handle->recv_cb = (uv_udp_recv_cb)0x0;
  handle->alloc_cb = (uv_alloc_cb)0x0;
  return;
}

Assistant:

void uv__udp_finish_close(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct uv__queue* q;

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
  assert(handle->io_watcher.fd == -1);

  while (!uv__queue_empty(&handle->write_queue)) {
    q = uv__queue_head(&handle->write_queue);
    uv__queue_remove(q);

    req = uv__queue_data(q, uv_udp_send_t, queue);
    req->status = UV_ECANCELED;
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
  }

  uv__udp_run_completed(handle);

  assert(handle->send_queue_size == 0);
  assert(handle->send_queue_count == 0);

  /* Now tear down the handle. */
  handle->recv_cb = NULL;
  handle->alloc_cb = NULL;
  /* but _do not_ touch close_cb */
}